

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

UChar32 __thiscall icu_63::UCharCharacterIterator::first32PostInc(UCharCharacterIterator *this)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  uint uVar5;
  uint uVar6;
  
  iVar2 = (this->super_CharacterIterator).begin;
  (this->super_CharacterIterator).pos = iVar2;
  iVar3 = (this->super_CharacterIterator).end;
  uVar5 = 0xffff;
  if (iVar2 < iVar3) {
    pcVar4 = this->text;
    (this->super_CharacterIterator).pos = iVar2 + 1;
    cVar1 = pcVar4[iVar2];
    uVar5 = (uint)(ushort)cVar1;
    if ((((cVar1 & 0xfc00U) == 0xd800) && (iVar2 + 1 != iVar3)) &&
       (uVar6 = (uint)(ushort)pcVar4[(long)iVar2 + 1], (uVar6 & 0xfc00) == 0xdc00)) {
      (this->super_CharacterIterator).pos = iVar2 + 2;
      uVar5 = (uint)(ushort)cVar1 * 0x400 + uVar6 + 0xfca02400;
    }
  }
  return uVar5;
}

Assistant:

UChar32
UCharCharacterIterator::first32PostInc() {
    pos = begin;
    if(pos < end) {
        UChar32 c;
        U16_NEXT(text, pos, end, c);
        return c;
    } else {
        return DONE;
    }
}